

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  pointer pcVar1;
  short *psVar2;
  ulong uVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  LogMessage *pLVar8;
  ostream *poVar9;
  CommandLineInterface *this_00;
  string parameters_1;
  string error;
  string parameters;
  string local_a8;
  string local_88;
  LogMessage local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    psVar2 = (short *)(output_directive->name)._M_dataplus._M_p;
    uVar3 = (output_directive->name)._M_string_length;
    if ((long)uVar3 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar3,"string length exceeds max size");
    }
    if ((uVar3 < 2) || (*psVar2 != 0x2d2d)) {
LAB_002339d2:
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x85e);
      pLVar8 = internal::LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar8 = internal::LogMessage::operator<<(pLVar8,"Bad name for plugin generator: ");
      pLVar8 = internal::LogMessage::operator<<(pLVar8,&output_directive->name);
      internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar8);
      internal::LogMessage::~LogMessage(&local_68);
    }
    else {
      pcVar1 = (output_directive->name)._M_dataplus._M_p;
      uVar3 = (output_directive->name)._M_string_length;
      if ((long)uVar3 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar3,"string length exceeds max size");
      }
      if ((uVar3 < 4) || (*(int *)(pcVar1 + (uVar3 - 4)) != 0x74756f5f)) goto LAB_002339d2;
    }
    anon_unknown_4::PluginName((string *)&local_68,&this->plugin_prefix_,&output_directive->name);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,(key_type *)&local_68);
    if (pmVar7->_M_string_length != 0) {
      if (local_a8._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a8);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->plugin_parameters_,(key_type *)&local_68);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    bVar5 = GeneratePluginOutput
                      (this,parsed_files,(string *)&local_68,&local_a8,generator_context,&local_88);
    if (bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((pointer)local_68._0_8_ != (pointer)((long)&local_68 + 0x10U)) {
LAB_00233af8:
        operator_delete((void *)local_68._0_8_);
      }
    }
    else {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((pointer)local_68._0_8_ != (pointer)((long)&local_68 + 0x10U)) {
        operator_delete((void *)local_68._0_8_);
      }
      if (!bVar5) goto LAB_00233c11;
    }
LAB_00233b98:
    bVar5 = true;
  }
  else {
    pcVar4 = (pointer)((long)&local_68 + 0x10);
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    local_68._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar7->_M_string_length != 0) {
      if (local_68.filename_ != (char *)0x0) {
        std::__cxx11::string::append((char *)&local_68);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    this_00 = (CommandLineInterface *)output_directive->generator;
    iVar6 = (**(_func_int **)((long)(this_00->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar5 = EnforceProto3OptionalSupport
                      (this_00,&output_directive->name,CONCAT44(extraout_var,iVar6),parsed_files);
    if (bVar5) {
      iVar6 = (*output_directive->generator->_vptr_CodeGenerator[3])
                        (output_directive->generator,parsed_files,&local_68,generator_context,
                         &local_88);
      if ((char)iVar6 != '\0') {
        if ((pointer)local_68._0_8_ != pcVar4) goto LAB_00233af8;
        goto LAB_00233b98;
      }
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_88._M_dataplus._M_p,local_88._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    if ((pointer)local_68._0_8_ != pcVar4) {
      operator_delete((void *)local_68._0_8_);
    }
LAB_00233c11:
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}